

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

int ebur128_loudness_shortterm(ebur128_state *st,double *out)

{
  int iVar1;
  double in_RAX;
  double dVar2;
  double energy;
  double local_18;
  
  local_18 = in_RAX;
  iVar1 = ebur128_energy_shortterm(st,&local_18);
  if (iVar1 == 0) {
    if (local_18 <= 0.0) {
      dVar2 = -INFINITY;
    }
    else {
      dVar2 = ebur128_energy_to_loudness(local_18);
    }
    *out = dVar2;
  }
  return iVar1;
}

Assistant:

int ebur128_loudness_shortterm(ebur128_state* st, double* out) {
  double energy;
  int error;

  error = ebur128_energy_shortterm(st, &energy);
  if (error) {
    return error;
  }

  if (energy <= 0.0) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  *out = ebur128_energy_to_loudness(energy);
  return EBUR128_SUCCESS;
}